

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

bool __thiscall DReachabilityPropagator::checkFinalSatisfied(DReachabilityPropagator *this)

{
  ulong uVar1;
  ostream *poVar2;
  bool *pbVar3;
  ulong uVar4;
  bool bVar5;
  bool local_3a;
  allocator_type local_39;
  vector<bool,_std::allocator<bool>_> local_38;
  
  local_3a = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_38,(long)(int)(this->super_GraphPropagator).vs.sz,&local_3a,&local_39);
  verificationDFS(this,this->root,&local_38);
  uVar1 = (ulong)(int)(this->super_GraphPropagator).vs.sz;
  if (0 < (long)uVar1) {
    pbVar3 = &((this->super_GraphPropagator).vs.data)->s;
    uVar4 = 0;
    bVar5 = false;
    do {
      if (((sat.assigns.data[*(uint *)(pbVar3 + -4)] != '\0') &&
          ((uint)*pbVar3 * -2 + 1 == (int)sat.assigns.data[*(uint *)(pbVar3 + -4)])) &&
         ((local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar4 >> 6 & 0x3ffffff] >> (uVar4 & 0x3f) & 1) ==
          0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"DreachabilityPropagator not satisfied (cannot reach node "
                   ,0x39);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/globals/dconnected.cpp"
                   ,0x62);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x363);
        local_3a = true;
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_3a,1);
        goto LAB_001cee3d;
      }
      uVar4 = uVar4 + 1;
      bVar5 = uVar1 <= uVar4;
      pbVar3 = pbVar3 + 0x10;
    } while (uVar1 != uVar4);
  }
  bVar5 = true;
LAB_001cee3d:
  if (local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return bVar5;
}

Assistant:

bool DReachabilityPropagator::checkFinalSatisfied() {
	std::vector<bool> v = std::vector<bool>(nbNodes(), false);
	verificationDFS(get_root_idx(), v);
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed() && getNodeVar(i).isTrue()) {
			assert(v[i]);
			if (!v[i]) {
				std::cerr << "DreachabilityPropagator not satisfied (cannot reach node " << i << ") "
									<< __FILE__ << ":" << __LINE__ << '\n';
				return false;
			}
		}
	}

	return true;
}